

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O3

void log_packet(LogContext *ctx,int direction,int type,char *texttype,void *data,size_t len,
               int n_blanks,logblank_t *blanks,unsigned_long *seq,uint downstream_id,
               char *additional_log_text)

{
  long lVar1;
  int *piVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ptrlen data_00;
  char dumpdata [128];
  tm local_170;
  char local_138 [12];
  char acStack_12c [49];
  undefined2 local_fb;
  undefined1 auStack_f9 [201];
  
  if (ctx->logtype == 4) {
    if (texttype == (char *)0x0) {
      ltime();
      strftime(local_138,0x18,"%Y-%m-%d %H:%M:%S",&local_170);
      pcVar4 = "Outgoing";
      if (direction == 0) {
        pcVar4 = "Incoming";
      }
      logprintf(ctx,"%s raw data at %s\r\n",pcVar4,local_138);
      goto LAB_00138b9b;
    }
  }
  else if (texttype == (char *)0x0 || ctx->logtype != 3) {
    return;
  }
  pcVar4 = "Outgoing";
  if (direction == 0) {
    pcVar4 = "Incoming";
  }
  logprintf(ctx,"%s packet ",pcVar4);
  if (seq != (unsigned_long *)0x0) {
    logprintf(ctx,"#0x%lx, ",*seq);
  }
  logprintf(ctx,"type %d / 0x%02x (%s)",(ulong)(uint)type,(ulong)(uint)type,texttype);
  if ((downstream_id != 0) &&
     (logprintf(ctx," on behalf of downstream #%u",(ulong)downstream_id),
     additional_log_text != (char *)0x0)) {
    logprintf(ctx," (%s)",additional_log_text);
  }
  logprintf(ctx,"\r\n");
LAB_00138b9b:
  if (len != 0) {
    uVar6 = (ulong)n_blanks;
    uVar5 = 0;
    uVar7 = 0;
    iVar12 = 0;
    lVar13 = 0;
    do {
      uVar8 = uVar7;
      if (uVar7 < uVar6) {
        piVar2 = &blanks[uVar7].type;
        do {
          if (uVar5 < (ulong)((long)piVar2[-1] + (long)((logblank_t *)(piVar2 + -2))->offset)) {
            uVar8 = uVar7;
            if ((ulong)(long)((logblank_t *)(piVar2 + -2))->offset <= uVar5) {
              iVar9 = *piVar2;
              goto LAB_00138c0f;
            }
            break;
          }
          uVar7 = uVar7 + 1;
          piVar2 = piVar2 + 3;
          uVar8 = uVar6;
        } while (uVar6 != uVar7);
      }
      iVar9 = 0;
      uVar7 = uVar8;
LAB_00138c0f:
      if (lVar13 != 0 && iVar9 != 2) {
        pcVar4 = "s";
        if (lVar13 == 1) {
          pcVar4 = "";
        }
        logprintf(ctx,"  (%zu byte%s omitted)\r\n",lVar13,pcVar4);
        lVar13 = 0;
      }
      if (lVar13 == 0 && iVar12 == 0) {
        sprintf(local_138,"  %08zx%*s\r\n",uVar5 & 0xfffffffffffffff0,0x43,"");
      }
      if (iVar9 == 1) {
        local_170.tm_sec._2_1_ = 0;
        local_170.tm_sec._0_2_ = 0x5858;
        uVar10 = 0x58;
        local_170.tm_sec._1_1_ = 'X';
        local_170.tm_sec._0_1_ = 'X';
LAB_00138cd9:
        uVar11 = (uint)uVar5 & 0xf;
        lVar1 = (ulong)uVar11 * 3;
        acStack_12c[lVar1] = (char)local_170.tm_sec;
        acStack_12c[lVar1 + 1] = local_170.tm_sec._1_1_;
        if (0x5e < uVar10 - 0x20) {
          uVar10 = 0x2e;
        }
        *(char *)((long)&local_fb + (ulong)uVar11) = (char)uVar10;
        iVar12 = uVar11 + 1;
      }
      else {
        if (iVar9 != 2) {
          uVar10 = (uint)*(byte *)((long)data + uVar5);
          sprintf((char *)&local_170,"%02x",(ulong)*(byte *)((long)data + uVar5));
          goto LAB_00138cd9;
        }
        lVar13 = lVar13 + 1;
      }
      uVar5 = uVar5 + 1;
      if ((uVar5 & 0xf) == 0) {
        iVar9 = 0;
        if (iVar12 != 0) goto LAB_00138d37;
      }
      else {
        iVar9 = iVar12;
        if ((lVar13 != 0 || uVar5 == len) && iVar12 != 0) {
LAB_00138d37:
          auStack_f9[iVar12] = 0;
          *(undefined2 *)((long)&local_fb + (long)iVar12) = 0xa0d;
          sVar3 = strlen(local_138);
          data_00.len = sVar3;
          data_00.ptr = local_138;
          logwrite(ctx,data_00);
          iVar9 = 0;
        }
      }
      iVar12 = iVar9;
    } while (uVar5 != len);
    if (lVar13 != 0) {
      pcVar4 = "s";
      if (lVar13 == 1) {
        pcVar4 = "";
      }
      logprintf(ctx,"  (%zu byte%s omitted)\r\n",lVar13,pcVar4);
    }
  }
  if ((0 < ctx->logtype) && (ctx->state == L_OPEN)) {
    fflush((FILE *)ctx->lgfp);
  }
  return;
}

Assistant:

void log_packet(LogContext *ctx, int direction, int type,
                const char *texttype, const void *data, size_t len,
                int n_blanks, const struct logblank_t *blanks,
                const unsigned long *seq,
                unsigned downstream_id, const char *additional_log_text)
{
    char dumpdata[128], smalldata[5];
    size_t p = 0, b = 0, omitted = 0;
    int output_pos = 0; /* NZ if pending output in dumpdata */

    if (!(ctx->logtype == LGTYP_SSHRAW ||
          (ctx->logtype == LGTYP_PACKETS && texttype)))
        return;

    /* Packet header. */
    if (texttype) {
        logprintf(ctx, "%s packet ",
                  direction == PKT_INCOMING ? "Incoming" : "Outgoing");

        if (seq)
            logprintf(ctx, "#0x%lx, ", *seq);

        logprintf(ctx, "type %d / 0x%02x (%s)", type, type, texttype);

        if (downstream_id) {
            logprintf(ctx, " on behalf of downstream #%u", downstream_id);
            if (additional_log_text)
                logprintf(ctx, " (%s)", additional_log_text);
        }

        logprintf(ctx, "\r\n");
    } else {
        /*
         * Raw data is logged with a timestamp, so that it's possible
         * to determine whether a mysterious delay occurred at the
         * client or server end. (Timestamping the raw data avoids
         * cluttering the normal case of only logging decrypted SSH
         * messages, and also adds conceptual rigour in the case where
         * an SSH message arrives in several pieces.)
         */
        char buf[256];
        struct tm tm;
        tm = ltime();
        strftime(buf, 24, "%Y-%m-%d %H:%M:%S", &tm);
        logprintf(ctx, "%s raw data at %s\r\n",
                  direction == PKT_INCOMING ? "Incoming" : "Outgoing",
                  buf);
    }

    /*
     * Output a hex/ASCII dump of the packet body, blanking/omitting
     * parts as specified.
     */
    while (p < len) {
        int blktype;

        /* Move to a current entry in the blanking array. */
        while ((b < n_blanks) &&
               (p >= blanks[b].offset + blanks[b].len))
            b++;
        /* Work out what type of blanking to apply to
         * this byte. */
        blktype = PKTLOG_EMIT; /* default */
        if ((b < n_blanks) &&
            (p >= blanks[b].offset) &&
            (p < blanks[b].offset + blanks[b].len))
            blktype = blanks[b].type;

        /* If we're about to stop omitting, it's time to say how
         * much we omitted. */
        if ((blktype != PKTLOG_OMIT) && omitted) {
            logprintf(ctx, "  (%"SIZEu" byte%s omitted)\r\n",
                      omitted, (omitted==1?"":"s"));
            omitted = 0;
        }

        /* (Re-)initialise dumpdata as necessary
         * (start of row, or if we've just stopped omitting) */
        if (!output_pos && !omitted)
            sprintf(dumpdata, "  %08"SIZEx"%*s\r\n",
                    p-(p%16), 1+3*16+2+16, "");

        /* Deal with the current byte. */
        if (blktype == PKTLOG_OMIT) {
            omitted++;
        } else {
            int c;
            if (blktype == PKTLOG_BLANK) {
                c = 'X';
                sprintf(smalldata, "XX");
            } else {  /* PKTLOG_EMIT */
                c = ((const unsigned char *)data)[p];
                sprintf(smalldata, "%02x", c);
            }
            dumpdata[10+2+3*(p%16)] = smalldata[0];
            dumpdata[10+2+3*(p%16)+1] = smalldata[1];
            dumpdata[10+1+3*16+2+(p%16)] = (c >= 0x20 && c < 0x7F ? c : '.');
            output_pos = (p%16) + 1;
        }

        p++;

        /* Flush row if necessary */
        if (((p % 16) == 0) || (p == len) || omitted) {
            if (output_pos) {
                strcpy(dumpdata + 10+1+3*16+2+output_pos, "\r\n");
                logwrite(ctx, ptrlen_from_asciz(dumpdata));
                output_pos = 0;
            }
        }

    }

    /* Tidy up */
    if (omitted)
        logprintf(ctx, "  (%"SIZEu" byte%s omitted)\r\n",
                  omitted, (omitted==1?"":"s"));
    logflush(ctx);
}